

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

Bool Ppmd8_Alloc(CPpmd8 *p,UInt32 size)

{
  Bool BVar1;
  Byte *pBVar2;
  UInt32 UVar3;
  
  if ((p->Base == (Byte *)0x0) || (BVar1 = 1, p->Size != size)) {
    free(p->Base);
    p->Size = 0;
    UVar3 = 4 - (size & 3);
    p->AlignOffset = UVar3;
    pBVar2 = (Byte *)malloc((ulong)(UVar3 + size));
    p->Base = pBVar2;
    if (pBVar2 == (Byte *)0x0) {
      BVar1 = 0;
    }
    else {
      p->Size = size;
      BVar1 = 1;
    }
  }
  return BVar1;
}

Assistant:

Bool Ppmd8_Alloc(CPpmd8 *p, UInt32 size)
{
  if (p->Base == 0 || p->Size != size)
  {
    Ppmd8_Free(p);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = malloc(p->AlignOffset + size)) == 0)
      return False;
    p->Size = size;
  }
  return True;
}